

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::parse_multipart_boundary(string *content_type,string *boundary)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  long *local_40 [2];
  long local_30 [2];
  
  bVar3 = false;
  lVar2 = std::__cxx11::string::find((char *)content_type,0x16a55b,0);
  if (lVar2 != -1) {
    std::__cxx11::string::find((char)content_type,0x3b);
    std::__cxx11::string::substr((ulong)local_40,(ulong)content_type);
    std::__cxx11::string::operator=((string *)boundary,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    if (((1 < boundary->_M_string_length) &&
        (pcVar1 = (boundary->_M_dataplus)._M_p, *pcVar1 == '\"')) &&
       (pcVar1[boundary->_M_string_length - 1] == '\"')) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)boundary);
      std::__cxx11::string::operator=((string *)boundary,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    bVar3 = boundary->_M_string_length != 0;
  }
  return bVar3;
}

Assistant:

inline bool parse_multipart_boundary(const std::string &content_type,
                                     std::string &boundary) {
  auto boundary_keyword = "boundary=";
  auto pos = content_type.find(boundary_keyword);
  if (pos == std::string::npos) { return false; }
  auto end = content_type.find(';', pos);
  auto beg = pos + strlen(boundary_keyword);
  boundary = content_type.substr(beg, end - beg);
  if (boundary.length() >= 2 && boundary.front() == '"' &&
      boundary.back() == '"') {
    boundary = boundary.substr(1, boundary.size() - 2);
  }
  return !boundary.empty();
}